

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::processSubstitutionGroup
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,
          ComplexTypeInfo **typeInfo,DatatypeValidator **validator,XMLCh *subsElemQName)

{
  uint namespaceURI;
  DatatypeValidator *pDVar1;
  QName *pQVar2;
  XMLCh *key1;
  GrammarResolver *this_00;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *this_01;
  MemoryManager *pMVar3;
  BaseRefVectorOf<xercesc_4_0::SchemaInfo> *this_02;
  ulong uVar4;
  XMLSize_t XVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  SchemaElementDecl *subsElemDecl;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar9;
  undefined4 extraout_var;
  Grammar *pGVar10;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *toCopy;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SchemaInfo *pSVar11;
  SchemaElementDecl *pSVar12;
  XMLSize_t XVar13;
  ulong uVar14;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  
  pSVar11 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar11;
  subsElemDecl = getGlobalElemDecl(this,elem,subsElemQName);
  if (subsElemDecl == (SchemaElementDecl *)0x0) goto LAB_0032e971;
  pSVar12 = subsElemDecl;
  if (subsElemDecl != elemDecl) {
    do {
      pSVar12 = pSVar12->fSubstitutionGroupElem;
      if (pSVar12 == elemDecl) break;
    } while (pSVar12 != (SchemaElementDecl *)0x0);
    if (pSVar12 == (SchemaElementDecl *)0x0) {
      bVar7 = isSubstitutionGroupValid
                        (this,elem,subsElemDecl,*typeInfo,*validator,
                         ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,true);
      if (!bVar7) goto LAB_0032e971;
      elemDecl->fSubstitutionGroupElem = subsElemDecl;
      if (*validator == (DatatypeValidator *)0x0 && *typeInfo == (ComplexTypeInfo *)0x0) {
        *typeInfo = subsElemDecl->fComplexTypeInfo;
        pDVar1 = subsElemDecl->fDatatypeValidator;
        *validator = pDVar1;
        if (pDVar1 == (DatatypeValidator *)0x0) {
          if (*typeInfo == (ComplexTypeInfo *)0x0) goto LAB_0032ea0d;
          elemDecl->fComplexTypeInfo = *typeInfo;
          iVar8 = (*typeInfo)->fContentType;
        }
        else {
          elemDecl->fDatatypeValidator = pDVar1;
          iVar8 = 5;
        }
        *(int *)&(elemDecl->super_XMLElementDecl).field_0x2c = iVar8;
      }
LAB_0032ea0d:
      pQVar2 = (subsElemDecl->super_XMLElementDecl).fElementName;
      key1 = pQVar2->fLocalPart;
      namespaceURI = pQVar2->fURIId;
      pVVar9 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
               ::get(this->fValidSubstitutionGroups,key1,namespaceURI);
      if (pVVar9 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
        if (this->fTargetNSURI != namespaceURI) {
          this_00 = this->fGrammarResolver;
          iVar8 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                            (this->fURIStringPool,(ulong)namespaceURI);
          pGVar10 = GrammarResolver::getGrammar(this_00,(XMLCh *)CONCAT44(extraout_var,iVar8));
          if (pGVar10 != (Grammar *)0x0) {
            toCopy = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                     ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                            *)pGVar10[10].super_XSerializable._vptr_XSerializable,key1,namespaceURI)
            ;
            if (toCopy != (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
              pVVar9 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
                       XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
              ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf(pVVar9,toCopy);
              RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
              ::put(this->fValidSubstitutionGroups,key1,namespaceURI,pVVar9);
              goto LAB_0032ebb3;
            }
            bVar7 = SchemaInfo::circularImportExist(this->fSchemaInfo,namespaceURI);
            if (bVar7) {
              this_01 = (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                         *)pGVar10[10].super_XSerializable._vptr_XSerializable;
              pVVar9 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
                       XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
              pMVar3 = this->fGrammarPoolMemoryManager;
              pVVar9->fCallDestructor = false;
              pVVar9->fCurCount = 0;
              pVVar9->fMaxCount = 8;
              pVVar9->fElemList = (SchemaElementDecl **)0x0;
              pVVar9->fMemoryManager = pMVar3;
              iVar8 = (*pMVar3->_vptr_MemoryManager[3])();
              pVVar9->fElemList = (SchemaElementDecl **)CONCAT44(extraout_var_00,iVar8);
              memset((SchemaElementDecl **)CONCAT44(extraout_var_00,iVar8),0,pVVar9->fMaxCount << 3)
              ;
              RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
              ::put(this_01,key1,namespaceURI,pVVar9);
            }
          }
        }
        pVVar9 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
                 XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
        pMVar3 = this->fGrammarPoolMemoryManager;
        pVVar9->fCallDestructor = false;
        pVVar9->fCurCount = 0;
        pVVar9->fMaxCount = 8;
        pVVar9->fElemList = (SchemaElementDecl **)0x0;
        pVVar9->fMemoryManager = pMVar3;
        iVar8 = (*pMVar3->_vptr_MemoryManager[3])();
        pVVar9->fElemList = (SchemaElementDecl **)CONCAT44(extraout_var_01,iVar8);
        memset((SchemaElementDecl **)CONCAT44(extraout_var_01,iVar8),0,pVVar9->fMaxCount << 3);
        RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
        ::put(this->fValidSubstitutionGroups,key1,namespaceURI,pVVar9);
      }
LAB_0032ebb3:
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ensureExtraCapacity(pVVar9,1);
      XVar13 = pVVar9->fCurCount;
      pVVar9->fCurCount = XVar13 + 1;
      pVVar9->fElemList[XVar13] = elemDecl;
      this_02 = &this->fSchemaInfo->fImportingInfoList->
                 super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
      if (this_02->fCurCount != 0) {
        XVar13 = 0;
        do {
          pSVar11 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt(this_02,XVar13);
          pGVar10 = GrammarResolver::getGrammar(this->fGrammarResolver,pSVar11->fTargetNSURIString);
          pVVar9 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                   ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                          *)pGVar10[10].super_XSerializable._vptr_XSerializable,key1,namespaceURI);
          if (pVVar9 != (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
            uVar4 = pVVar9->fCurCount;
            if (uVar4 == 0) {
LAB_0032ec4c:
              ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ensureExtraCapacity(pVVar9,1);
              XVar5 = pVVar9->fCurCount;
              pVVar9->fCurCount = XVar5 + 1;
              pVVar9->fElemList[XVar5] = elemDecl;
            }
            else if (*pVVar9->fElemList != elemDecl) {
              uVar6 = 1;
              do {
                uVar14 = uVar6;
                if (uVar4 == uVar14) break;
                uVar6 = uVar14 + 1;
              } while (pVVar9->fElemList[uVar14] != elemDecl);
              if (uVar4 <= uVar14) goto LAB_0032ec4c;
            }
          }
          XVar13 = XVar13 + 1;
        } while (XVar13 < this_02->fCurCount);
      }
      buildValidSubstitutionListB(this,elem,elemDecl,subsElemDecl);
      buildValidSubstitutionListF(this,elem,elemDecl,subsElemDecl);
      goto LAB_0032e971;
    }
  }
  reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x93,
                    ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,(XMLCh *)0x0,
                    (XMLCh *)0x0,(XMLCh *)0x0);
LAB_0032e971:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return;
}

Assistant:

void TraverseSchema::processSubstitutionGroup(const DOMElement* const elem,
                                              SchemaElementDecl* const elemDecl,
                                              ComplexTypeInfo*& typeInfo,
                                              DatatypeValidator*& validator,
                                              const XMLCh* const subsElemQName)
{
    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    SchemaElementDecl* subsElemDecl = getGlobalElemDecl(elem, subsElemQName);
    if (subsElemDecl)
    {
        if (isSubstitutionGroupCircular(elemDecl, subsElemDecl))
        {
            reportSchemaError(
                elem , XMLUni::fgXMLErrDomain , XMLErrs::CircularSubsGroup, elemDecl->getBaseName());
        }
        else
        {
            // Check for substitution validity constraint
            // Substitution allowed (block and blockDefault) && same type
            if (isSubstitutionGroupValid(elem, subsElemDecl, typeInfo, validator, elemDecl->getBaseName()))
            {
                elemDecl->setSubstitutionGroupElem(subsElemDecl);

                // if type information is missing, use subsGroup one
                if (!typeInfo && !validator)
                {
                    typeInfo = subsElemDecl->getComplexTypeInfo();
                    validator = subsElemDecl->getDatatypeValidator();

                    if (validator)
                    {
                        elemDecl->setDatatypeValidator(validator);
                        elemDecl->setModelType(SchemaElementDecl::Simple);
                    }
                    else if (typeInfo)
                    {
                        elemDecl->setComplexTypeInfo(typeInfo);
                        elemDecl->setModelType((SchemaElementDecl::ModelTypes)typeInfo->getContentType());
                    }
                }

                XMLCh* subsElemBaseName = subsElemDecl->getBaseName();
                int    subsElemURI = subsElemDecl->getURI();
                ValueVectorOf<SchemaElementDecl*>* subsElements =
                    fValidSubstitutionGroups->get(subsElemBaseName, subsElemURI);

                if (!subsElements && fTargetNSURI != subsElemURI)
                {
                    SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(fURIStringPool->getValueForId(subsElemURI));

                    if (aGrammar)
                    {
                        subsElements = aGrammar->getValidSubstitutionGroups()->get(subsElemBaseName, subsElemURI);

                        if (subsElements)
                        {
                            subsElements = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(*subsElements);
                            fValidSubstitutionGroups->put(subsElemBaseName, subsElemURI, subsElements);
                        }
                        else if (fSchemaInfo->circularImportExist(subsElemURI))
                        {
                            aGrammar->getValidSubstitutionGroups()->put(
                            subsElemBaseName, subsElemURI, new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(8, fGrammarPoolMemoryManager));
                        }
                    }
                }

                if (!subsElements)
                {
                    subsElements = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(8, fGrammarPoolMemoryManager);
                    fValidSubstitutionGroups->put(subsElemBaseName, subsElemURI, subsElements);
                }

                subsElements->addElement(elemDecl);

                // update related subs. info in case of circular import
                BaseRefVectorEnumerator<SchemaInfo> importingEnum = fSchemaInfo->getImportingListEnumerator();

                while (importingEnum.hasMoreElements())
                {
                    const SchemaInfo& curRef = importingEnum.nextElement();
                    SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(curRef.getTargetNSURIString());
                    ValueVectorOf<SchemaElementDecl*>* subsElemList =
                        aGrammar->getValidSubstitutionGroups()->get(subsElemBaseName, subsElemURI);

                    if (subsElemList && !subsElemList->containsElement(elemDecl))
                        subsElemList->addElement(elemDecl);
                }

                buildValidSubstitutionListB(elem, elemDecl, subsElemDecl);
                buildValidSubstitutionListF(elem, elemDecl, subsElemDecl);
            }
        }
    }
}